

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_escape_new(mpc_val_t *x,char *input,char **output)

{
  size_t sVar1;
  size_t sVar2;
  char *local_40;
  char *y;
  char *s;
  int local_28;
  int iStack_24;
  char buff [2];
  int found;
  int i;
  char **output_local;
  char *input_local;
  mpc_val_t *x_local;
  
  local_40 = (char *)calloc(1,1);
  y = (char *)x;
  do {
    if (*y == '\0') {
      return local_40;
    }
    local_28 = 0;
    for (iStack_24 = 0; output[iStack_24] != (char *)0x0; iStack_24 = iStack_24 + 1) {
      if (*y == input[iStack_24]) {
        sVar1 = strlen(local_40);
        sVar2 = strlen(output[iStack_24]);
        local_40 = (char *)realloc(local_40,sVar1 + sVar2 + 1);
        strcat(local_40,output[iStack_24]);
        local_28 = 1;
        break;
      }
    }
    if (local_28 == 0) {
      sVar1 = strlen(local_40);
      local_40 = (char *)realloc(local_40,sVar1 + 2);
      s._6_1_ = *y;
      s._7_1_ = 0;
      strcat(local_40,(char *)((long)&s + 6));
    }
    y = y + 1;
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_escape_new(mpc_val_t *x, const char *input, const char **output) {

  int i;
  int found;
  char buff[2];
  char *s = x;
  char *y = calloc(1, 1);

  while (*s) {

    i = 0;
    found = 0;

    while (output[i]) {
      if (*s == input[i]) {
        y = realloc(y, strlen(y) + strlen(output[i]) + 1);
        strcat(y, output[i]);
        found = 1;
        break;
      }
      i++;
    }

    if (!found) {
      y = realloc(y, strlen(y) + 2);
      buff[0] = *s; buff[1] = '\0';
      strcat(y, buff);
    }

    s++;
  }


  return y;
}